

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall
cmCTestSVN::ExternalParser::ExternalParser(ExternalParser *this,cmCTestSVN *svn,char *prefix)

{
  char *prefix_local;
  cmCTestSVN *svn_local;
  ExternalParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__ExternalParser_00a85eb8;
  this->SVN = svn;
  cmsys::RegularExpression::RegularExpression(&this->RegexExternal);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(svn->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexExternal,"^X..... +(.+)$");
  return;
}

Assistant:

ExternalParser(cmCTestSVN* svn, const char* prefix)
    : SVN(svn)
  {
    this->SetLog(&svn->Log, prefix);
    this->RegexExternal.compile("^X..... +(.+)$");
  }